

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O2

vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> * __thiscall
banksia::TourMng::getKnockoutWinnerList
          (vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *__return_storage_ptr__
          ,TourMng *this)

{
  string *__lhs;
  pointer pMVar1;
  __type _Var2;
  int iVar3;
  iterator iVar4;
  mapped_type *this_00;
  _Base_ptr p_Var5;
  value_type *__x;
  int *__k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nameList;
  map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
  pairMap;
  TourPlayerPair thePair;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lostSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  _Rb_tree<int,_std::pair<const_int,_banksia::TourPlayerPair>,_std::_Select1st<std::pair<const_int,_banksia::TourPlayerPair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
  local_130;
  undefined1 local_100 [44];
  int local_d4 [9];
  value_type local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = getLastRound(this);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar1 = (this->matchRecordList).
           super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __lhs = &local_b0.name;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__k = &((this->matchRecordList).
               super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>.
               _M_impl.super__Vector_impl_data._M_start)->pairId; (pointer)(__k + -0x2e) != pMVar1;
      __k = __k + 0x30) {
    if (__k[-1] == iVar3) {
      TourPlayerPair::TourPlayerPair((TourPlayerPair *)local_100);
      iVar4 = std::
              _Rb_tree<int,_std::pair<const_int,_banksia::TourPlayerPair>,_std::_Select1st<std::pair<const_int,_banksia::TourPlayerPair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
              ::find(&local_130,__k);
      if ((_Rb_tree_header *)iVar4._M_node == &local_130._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::_M_assign((string *)(local_100 + 8));
        std::__cxx11::string::_M_assign((string *)__lhs);
      }
      else {
        TourPlayerPair::operator=
                  ((TourPlayerPair *)local_100,(TourPlayerPair *)&iVar4._M_node[1]._M_parent);
      }
      if ((((Result *)(__k + -0xc))->result | draw) == loss) {
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(__k + -0x22));
        local_d4[(ulong)((((Result *)(__k + -0xc))->result != win) != _Var2) * 0x14] =
             local_d4[(ulong)((((Result *)(__k + -0xc))->result != win) != _Var2) * 0x14] + 1;
      }
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(__k + -0x22));
      local_d4[(ulong)_Var2 * 0x14 + 7] = local_d4[(ulong)_Var2 * 0x14 + 7] + 1;
      this_00 = std::
                map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
                ::operator[]((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
                              *)&local_130,__k);
      TourPlayerPair::operator=(this_00,(TourPlayerPair *)local_100);
      TourPlayerPair::~TourPlayerPair((TourPlayerPair *)local_100);
    }
  }
  for (p_Var5 = local_130._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_130._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    TourPlayerPair::TourPlayerPair
              ((TourPlayerPair *)local_100,(TourPlayerPair *)&p_Var5[1]._M_parent);
    if ((local_b0.winCnt < local_d4[0]) ||
       ((__x = &local_b0, local_d4[0] == local_b0.winCnt && (local_d4[7] < local_b0.whiteCnt)))) {
      __x = (value_type *)local_100;
    }
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::push_back
              (__return_storage_ptr__,__x);
    TourPlayerPair::~TourPlayerPair((TourPlayerPair *)local_100);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_banksia::TourPlayerPair>,_std::_Select1st<std::pair<const_int,_banksia::TourPlayerPair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
  ::~_Rb_tree(&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TourPlayer> TourMng::getKnockoutWinnerList()
{
    std::vector<TourPlayer> winList;
    auto lastRound = getLastRound();
    
    std::set<std::string> lostSet;
    std::vector<std::string> nameList;
    std::map<int, TourPlayerPair> pairMap;
    
    for(auto && r : matchRecordList) {
        if (r.round != lastRound) {
            continue;
        }
        
        assert(r.state == MatchState::completed);
        TourPlayerPair thePair;
        auto it = pairMap.find(r.pairId);
        if (it != pairMap.end()) thePair = it->second;
        else {
            thePair.pair[0].name = r.playernames[0];
            thePair.pair[1].name = r.playernames[1];
        }
        
        if (r.result.result == ResultType::win || r.result.result == ResultType::loss) {
            auto idxW = thePair.pair[W].name == r.playernames[W] ? W : B;
            auto winIdx = r.result.result == ResultType::win ? idxW : (1 - idxW);
            thePair.pair[winIdx].winCnt++;
        }
        auto whiteSd = thePair.pair[W].name == r.playernames[W] ? W : B;
        thePair.pair[whiteSd].whiteCnt++;
        pairMap[r.pairId] = thePair;
    }
    
    for(auto && p : pairMap) {
        auto thePair = p.second;
        assert(thePair.pair[0].winCnt != thePair.pair[1].winCnt || thePair.pair[0].whiteCnt != thePair.pair[1].whiteCnt);
        auto winIdx = W;
        if (thePair.pair[B].winCnt > thePair.pair[W].winCnt ||
            (thePair.pair[B].winCnt == thePair.pair[W].winCnt && thePair.pair[B].whiteCnt < thePair.pair[W].whiteCnt)) {
            winIdx = B;
        }
        winList.push_back(thePair.pair[winIdx]);
    }
    
    return winList;
}